

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,PropertyRecord **value)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int **ppiVar5;
  SimpleHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  **ppSVar6;
  SimpleHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  *pSVar7;
  undefined4 *puVar8;
  long lVar9;
  uint local_78;
  int local_74;
  uint depth;
  int profileIndex;
  WriteBarrierPtr<const_Js::PropertyRecord> local_68;
  int local_60;
  int index;
  int local_4c;
  SimpleHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  *pSStack_48;
  int i;
  EntryType *localEntries;
  uint depth_1;
  uint targetBucket;
  hash_t hashCode;
  bool needSearch;
  int *localBuckets;
  PropertyRecord **value_local;
  PropertyRecord **key_local;
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  localBuckets = (int *)value;
  value_local = key;
  key_local = (PropertyRecord **)this;
  ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  _hashCode = *ppiVar5;
  if (_hashCode == (int *)0x0) {
    BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    _hashCode = *ppiVar5;
  }
  targetBucket._3_1_ = 1;
  depth_1 = BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetHashCode(value_local);
  localEntries._4_4_ =
       BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       ::GetBucket((BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)this,depth_1);
  localEntries._0_4_ = 0;
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                      ((WriteBarrierPtr *)(this + 8));
  pSStack_48 = *ppSVar6;
  local_4c = _hashCode[localEntries._4_4_];
  while( true ) {
    if (local_4c < 0) {
      if (*(long *)(this + 0x30) != 0) {
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),(uint)localEntries);
      }
      bVar3 = anon_unknown_26::
              ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
              ::SupportsCleanup();
      if (((bVar3) && (*(int *)(this + 0x28) == 0)) &&
         (*(int *)(this + 0x20) == *(int *)(this + 0x18))) {
        MapAndRemoveIf<JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>(Js::PropertyRecord_const*const&,Js::PropertyRecord_const*const&)::_lambda(JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>>&)_1_>
                  (this);
      }
      if (*(int *)(this + 0x28) == 0) {
        if (*(int *)(this + 0x20) == *(int *)(this + 0x18)) {
          BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Resize((BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)this);
          localEntries._4_4_ =
               BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::GetBucket((BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            *)this,depth_1);
          local_60 = *(int *)(this + 0x20);
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
        }
        else {
          local_60 = *(int *)(this + 0x20);
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
        }
        if (*(int *)(this + 0x18) < *(int *)(this + 0x20)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3f1,"(count <= size)","count <= size");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (*(int *)(this + 0x18) <= local_60) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3f2,"(index < size)","index < size");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
      }
      else {
        if (*(int *)(this + 0x28) < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d4,"(freeCount > 0)","freeCount > 0");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (*(int *)(this + 0x24) < 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d5,"(freeList >= 0)","freeList >= 0");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d6,"(freeList < count)","freeList < count");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_60 = *(int *)(this + 0x24);
        *(int *)(this + 0x28) = *(int *)(this + 0x28) + -1;
        if (*(int *)(this + 0x28) != 0) {
          ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                              ((WriteBarrierPtr *)(this + 8));
          iVar4 = BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::GetNextFreeEntryIndex(*ppSVar6 + local_60);
          *(int *)(this + 0x24) = iVar4;
        }
      }
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                          ((WriteBarrierPtr *)(this + 8));
      pSVar7 = *ppSVar6;
      lVar9 = (long)local_60;
      Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr(&local_68,*value_local);
      Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr
                ((WriteBarrierPtr<const_Js::PropertyRecord> *)&depth,
                 *(PropertyRecord **)localBuckets);
      DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      ::Set(&pSVar7[lVar9].
             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            ,&local_68,(WriteBarrierPtr<const_Js::PropertyRecord> *)&depth,depth_1);
      ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
      iVar4 = (*ppiVar5)[localEntries._4_4_];
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                          ((WriteBarrierPtr *)(this + 8));
      iVar2 = local_60;
      (*ppSVar6)[local_60].
      super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .
      super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
      .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.next = iVar4;
      ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
      (*ppiVar5)[localEntries._4_4_] = iVar2;
      local_74 = local_60;
      local_78 = 1;
      while (ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                                 ((WriteBarrierPtr *)(this + 8)),
            (*ppSVar6)[local_74].
            super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            .
            super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
            .
            super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
            .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.next != -1) {
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                            ((WriteBarrierPtr *)(this + 8));
        local_74 = (*ppSVar6)[local_74].
                   super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                   .
                   super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
                   .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.next;
        local_78 = local_78 + 1;
      }
      if (*(long *)(this + 0x30) != 0) {
        DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),local_78);
      }
      return local_60;
    }
    bVar3 = DefaultHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            ::KeyEquals<DefaultComparer<Js::PropertyRecord_const*>,Js::PropertyRecord_const*>
                      ((DefaultHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                        *)(pSStack_48 + local_4c),value_local,depth_1);
    if (bVar3) break;
    localEntries._0_4_ = (uint)localEntries + 1;
    local_4c = pSStack_48[local_4c].
               super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
               .
               super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
               .
               super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
               .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.next;
  }
  if (*(long *)(this + 0x30) != 0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),(uint)localEntries);
  }
  pSVar7 = pSStack_48 + local_4c;
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr
            ((WriteBarrierPtr<const_Js::PropertyRecord> *)&index,*(PropertyRecord **)localBuckets);
  anon_unknown_26::
  ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
  ::SetValue((ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
              *)pSVar7,(WriteBarrierPtr<const_Js::PropertyRecord> *)&index);
  return local_4c;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }